

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManOrigIdsRemapPairsInsert(Vec_Int_t *vMap,int One,int Two)

{
  uint uVar1;
  uint uVar2;
  
  while( true ) {
    uVar2 = Two;
    if (One < Two) {
      uVar2 = One;
    }
    uVar1 = Two;
    if (Two < One) {
      uVar1 = One;
    }
    if (One == Two) break;
    if (((int)uVar1 < 0) || (vMap->nSize <= (int)uVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    Two = vMap->pArray[uVar1];
    One = uVar2;
    if (Two == 0xffffffff) {
      vMap->pArray[uVar1] = uVar2;
      return;
    }
  }
  __assert_fail("Smo != Big",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                ,0x4b,"void Gia_ManOrigIdsRemapPairsInsert(Vec_Int_t *, int, int)");
}

Assistant:

void Gia_ManOrigIdsRemapPairsInsert( Vec_Int_t * vMap, int One, int Two )
{
    int Smo = One < Two ? One : Two;
    int Big = One < Two ? Two : One;
    assert( Smo != Big );
    if ( Vec_IntEntry(vMap, Big) == -1 )
        Vec_IntWriteEntry( vMap, Big, Smo );
    else
        Gia_ManOrigIdsRemapPairsInsert( vMap, Smo, Vec_IntEntry(vMap, Big) );
}